

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O3

string * __thiscall CFG::toDOT_abi_cxx11_(string *__return_storage_ptr__,CFG *this)

{
  int iVar1;
  Type TVar2;
  BlockData *this_00;
  _List_node_base *p_Var3;
  long lVar4;
  CfgNode *node;
  CfgNode *node_00;
  ostream *poVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  _Rb_tree_node_base *p_Var8;
  long lVar9;
  long lVar10;
  _Self __tmp;
  char *pcVar11;
  _List_node_base *p_Var12;
  list<Instruction_*,_std::allocator<Instruction_*>_> instrs;
  stringstream ss;
  int local_26c;
  _List_node_base local_260;
  long local_250;
  string *local_248;
  stringstream local_240 [16];
  long local_230 [2];
  undefined8 uStack_220;
  uint auStack_218 [22];
  ios_base local_1c0 [112];
  char acStack_150 [152];
  _Rb_tree<CfgSignalHandler_*,_CfgSignalHandler_*,_std::_Identity<CfgSignalHandler_*>,_std::less<CfgSignalHandler_*>,_std::allocator<CfgSignalHandler_*>_>
  local_b8;
  _Rb_tree<CfgCall_*,_CfgCall_*,_std::_Identity<CfgCall_*>,_std::less<CfgCall_*>,_std::allocator<CfgCall_*>_>
  local_88;
  _Rb_tree_node_base *local_58;
  string local_50;
  
  local_248 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_240);
  *(uint *)((long)auStack_218 + *(long *)(local_230[0] + -0x18)) =
       *(uint *)((long)auStack_218 + *(long *)(local_230[0] + -0x18)) & 0xffffffb5 | 8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"digraph \"0x",0xb);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_230);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" {",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"  label = \"0x",0xd);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_230);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(this->m_functionName)._M_dataplus._M_p,
                      (this->m_functionName)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,")\"",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"  labelloc = \"t\"",0x10)
  ;
  std::ios::widen((char)*(undefined8 *)(local_230[0] + -0x18) + (char)local_230);
  std::ostream::put((char)local_230);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_230,"  node[shape=record]",0x14);
  std::ios::widen((char)*(undefined8 *)(local_230[0] + -0x18) + (char)local_230);
  std::ostream::put((char)local_230);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(local_230[0] + -0x18) + (char)local_230);
  std::ostream::put((char)local_230);
  std::ostream::flush();
  p_Var6 = (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_58 = &(this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var6 != local_58) {
    local_26c = 1;
    do {
      lVar10 = *(long *)(p_Var6 + 1);
      switch(*(undefined4 *)(lVar10 + 8)) {
      case 0:
        lVar10 = 0x51;
        pcVar11 = 
        "  Entry [label=\"\",width=0.3,height=0.3,shape=circle,fillcolor=black,style=filled]";
        break;
      case 1:
        this_00 = *(BlockData **)(lVar10 + 0x10);
        if (this_00 == (BlockData *)0x0) {
          __assert_fail("node->data() != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                        ,0x120,"std::string CFG::toDOT() const");
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"  \"0x",5);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_230);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" [label=\"{",0xb);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"    0x",6);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_230);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," [",2);
        *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
             *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,this_00->m_size);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]\\l",3);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        std::__cxx11::list<Instruction_*,_std::allocator<Instruction_*>_>::list
                  ((list<Instruction_*,_std::allocator<Instruction_*>_> *)&local_260,
                   &this_00->m_instrs);
        if (local_250 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_230,"    | [instrs]\\l",0x10);
          std::ios::widen((char)*(undefined8 *)(local_230[0] + -0x18) + (char)local_230);
          std::ostream::put((char)local_230);
          std::ostream::flush();
          for (p_Var12 = local_260._M_next; p_Var12 != &local_260; p_Var12 = p_Var12->_M_next) {
            p_Var3 = p_Var12[1]._M_next;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_230,"    &nbsp;&nbsp;0x",0x12);
            *(uint *)((long)auStack_218 + *(long *)(local_230[0] + -0x18)) =
                 *(uint *)((long)auStack_218 + *(long *)(local_230[0] + -0x18)) & 0xffffffb5 | 8;
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_230);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," \\<+",4);
            *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
                 *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
            poVar5 = (ostream *)
                     std::ostream::operator<<((ostream *)poVar5,*(int *)&p_Var3[1]._M_next);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\\>: ",4);
            dotFilter((string *)&local_88,(string *)&p_Var3[1]._M_prev);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,(char *)local_88._M_impl._0_8_,
                                local_88._M_impl.super__Rb_tree_header._M_header._0_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\\l",2);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
            if ((_Base_ptr *)local_88._M_impl._0_8_ !=
                &local_88._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)local_88._M_impl._0_8_);
            }
          }
        }
        CfgNode::BlockData::calls
                  ((set<CfgCall_*,_std::less<CfgCall_*>,_std::allocator<CfgCall_*>_> *)&local_88,
                   this_00);
        if (local_88._M_impl.super__Rb_tree_header._M_node_count != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_230,"    | [calls]\\l",0xf);
          std::ios::widen((char)*(undefined8 *)(local_230[0] + -0x18) + (char)local_230);
          std::ostream::put((char)local_230);
          std::ostream::flush();
          for (p_Var7 = local_88._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var7 != &local_88._M_impl.super__Rb_tree_header;
              p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
            lVar10 = *(long *)(*(long *)(p_Var7 + 1) + 8);
            lVar9 = *(long *)(*(long *)(p_Var7 + 1) + 0x10);
            *(uint *)((long)auStack_218 + *(long *)(local_230[0] + -0x18)) =
                 *(uint *)((long)auStack_218 + *(long *)(local_230[0] + -0x18)) & 0xffffffb5 | 8;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_230,"    &nbsp;&nbsp;0x",0x12);
            std::ostream::_M_insert<unsigned_long>((ulong)local_230);
            if (lVar9 != 0) {
              *(uint *)((long)auStack_218 + *(long *)(local_230[0] + -0x18)) =
                   *(uint *)((long)auStack_218 + *(long *)(local_230[0] + -0x18)) & 0xffffffb5 | 2;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230," \\{",3);
              poVar5 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)local_230);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\\} ",3);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230," (",2);
            dotFilter((string *)&local_b8,(string *)(lVar10 + 0x18));
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_230,(char *)local_b8._M_impl._0_8_,
                                local_b8._M_impl.super__Rb_tree_header._M_header._0_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,")\\l",3);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
            if ((_Base_ptr *)local_b8._M_impl._0_8_ !=
                &local_b8._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)local_b8._M_impl._0_8_);
            }
          }
        }
        CfgNode::BlockData::signalHandlers
                  ((set<CfgSignalHandler_*,_std::less<CfgSignalHandler_*>,_std::allocator<CfgSignalHandler_*>_>
                    *)&local_b8,this_00);
        if (local_b8._M_impl.super__Rb_tree_header._M_node_count != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_230,"    | [signals]\\l",0x11);
          std::ios::widen((char)*(undefined8 *)(local_230[0] + -0x18) + (char)local_230);
          std::ostream::put((char)local_230);
          std::ostream::flush();
          for (p_Var7 = local_b8._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var7 != &local_b8._M_impl.super__Rb_tree_header;
              p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
            lVar10 = *(long *)(p_Var7 + 1);
            iVar1 = *(int *)(lVar10 + 8);
            lVar9 = *(long *)(lVar10 + 0x10);
            lVar10 = *(long *)(lVar10 + 0x18);
            *(uint *)((long)auStack_218 + *(long *)(local_230[0] + -0x18)) =
                 *(uint *)((long)auStack_218 + *(long *)(local_230[0] + -0x18)) & 0xffffffb5 | 2;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_230,"    &nbsp;&nbsp;",0x10);
            lVar4 = *(long *)(local_230[0] + -0x18);
            if (acStack_150[lVar4 + 1] == '\0') {
              std::ios::widen((char)local_230 + (char)lVar4);
              acStack_150[lVar4 + 1] = '\x01';
            }
            acStack_150[lVar4] = '0';
            *(undefined8 *)((long)&uStack_220 + *(long *)(local_230[0] + -0x18)) = 2;
            poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_230,iVar1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
            *(uint *)((long)auStack_218 + *(long *)(local_230[0] + -0x18)) =
                 *(uint *)((long)auStack_218 + *(long *)(local_230[0] + -0x18)) & 0xffffffb5 | 8;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"0x",2);
            std::ostream::_M_insert<unsigned_long>((ulong)local_230);
            if (lVar10 != 0) {
              *(uint *)((long)auStack_218 + *(long *)(local_230[0] + -0x18)) =
                   *(uint *)((long)auStack_218 + *(long *)(local_230[0] + -0x18)) & 0xffffffb5 | 2;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230," \\{",3);
              poVar5 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)local_230);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\\} ",3);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230," (",2);
            dotFilter(&local_50,(string *)(lVar9 + 0x18));
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_230,local_50._M_dataplus._M_p,
                                local_50._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,")\\l",3);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"  }\"]",5);
        std::ios::widen((char)*(undefined8 *)(local_230[0] + -0x18) + (char)local_230);
        std::ostream::put((char)local_230);
        std::ostream::flush();
        if (this_00->m_indirect == true) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"  \"Unknown",10);
          *(uint *)((long)auStack_218 + *(long *)(local_230[0] + -0x18)) =
               *(uint *)((long)auStack_218 + *(long *)(local_230[0] + -0x18)) & 0xffffffb5 | 2;
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_230,local_26c);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,"\" [label=\"?\", shape=none]",0x19);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"  \"0x",5);
          *(uint *)((long)auStack_218 + *(long *)(local_230[0] + -0x18)) =
               *(uint *)((long)auStack_218 + *(long *)(local_230[0] + -0x18)) & 0xffffffb5 | 8;
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_230);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" -> \"Unknown",0xd);
          *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
               *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,local_26c);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" [style=dashed]",0x10);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          local_26c = local_26c + 1;
        }
        *(uint *)((long)auStack_218 + *(long *)(local_230[0] + -0x18)) =
             *(uint *)((long)auStack_218 + *(long *)(local_230[0] + -0x18)) & 0xffffffb5 | 8;
        std::
        _Rb_tree<CfgSignalHandler_*,_CfgSignalHandler_*,_std::_Identity<CfgSignalHandler_*>,_std::less<CfgSignalHandler_*>,_std::allocator<CfgSignalHandler_*>_>
        ::~_Rb_tree(&local_b8);
        std::
        _Rb_tree<CfgCall_*,_CfgCall_*,_std::_Identity<CfgCall_*>,_std::less<CfgCall_*>,_std::allocator<CfgCall_*>_>
        ::~_Rb_tree(&local_88);
        p_Var12 = local_260._M_next;
        while (p_Var12 != &local_260) {
          p_Var3 = p_Var12->_M_next;
          operator_delete(p_Var12);
          p_Var12 = p_Var3;
        }
        goto LAB_0010861c;
      case 2:
        if (*(long *)(lVar10 + 0x10) == 0) {
          __assert_fail("node->data() != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                        ,0x163,"std::string CFG::toDOT() const");
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"  \"0x",5);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_230);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" [label=\"{",0xb);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"     0x",7);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_230);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\\l",2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_230,"  }\", style=dashed]",0x13);
        std::ios::widen((char)*(undefined8 *)(local_230[0] + -0x18) + (char)local_230);
        std::ostream::put((char)local_230);
        std::ostream::flush();
        goto LAB_0010861c;
      case 3:
        lVar10 = 0x5e;
        pcVar11 = 
        "  Exit [label=\"\",width=0.3,height=0.3,shape=circle,fillcolor=black,style=filled,peripheries=2]"
        ;
        break;
      case 4:
        lVar10 = 0x5e;
        pcVar11 = 
        "  Halt [label=\"\",width=0.3,height=0.3,shape=square,fillcolor=black,style=filled,peripheries=2]"
        ;
        break;
      default:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                      ,0x16d,"std::string CFG::toDOT() const");
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,pcVar11,lVar10);
      std::ios::widen((char)*(undefined8 *)(local_230[0] + -0x18) + (char)local_230);
      std::ostream::put((char)local_230);
      std::ostream::flush();
LAB_0010861c:
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while (p_Var6 != local_58);
  }
  p_Var8 = (this->m_edges)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var8 == &(this->m_edges)._M_t._M_impl.super__Rb_tree_header) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"}",1);
      std::ios::widen((char)*(undefined8 *)(local_230[0] + -0x18) + (char)local_230);
      std::ostream::put((char)local_230);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream(local_240);
      std::ios_base::~ios_base(local_1c0);
      return local_248;
    }
    lVar10 = *(long *)(p_Var8 + 1);
    *(uint *)((long)auStack_218 + *(long *)(local_230[0] + -0x18)) =
         *(uint *)((long)auStack_218 + *(long *)(local_230[0] + -0x18)) & 0xffffffb5 | 8;
    node = *(CfgNode **)(lVar10 + 8);
    if (node->m_type - CFG_BLOCK < 2) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"  \"0x",5);
      CfgNode::node2addr(node);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_230);
      lVar9 = 5;
      pcVar11 = "\" -> ";
    }
    else {
      lVar9 = 0xb;
      poVar5 = (ostream *)local_230;
      pcVar11 = "  Entry -> ";
      if (node->m_type != CFG_ENTRY) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                      ,0x17e,"std::string CFG::toDOT() const");
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar11,lVar9);
    node_00 = *(CfgNode **)(lVar10 + 0x10);
    TVar2 = node_00->m_type;
    if (TVar2 - CFG_BLOCK < 2) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"\"0x",3);
      CfgNode::node2addr(node_00);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_230);
      lVar10 = 1;
      pcVar11 = "\"";
    }
    else {
      lVar10 = 4;
      if (TVar2 == CFG_EXIT) {
        poVar5 = (ostream *)local_230;
        pcVar11 = "Exit";
      }
      else {
        if (TVar2 != CFG_HALT) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                        ,399,"std::string CFG::toDOT() const");
        }
        poVar5 = (ostream *)local_230;
        pcVar11 = "Halt";
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar11,lVar10);
    TVar2 = node->m_type;
    *(uint *)((long)auStack_218 + *(long *)(local_230[0] + -0x18)) =
         *(uint *)((long)auStack_218 + *(long *)(local_230[0] + -0x18)) & 0xffffffb5 | 2;
    if (TVar2 == CFG_ENTRY) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230," [label=\" ",10);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230," [label=\" ",10);
    }
    poVar5 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)local_230);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"]",2);
    std::ios::widen((char)*(undefined8 *)(local_230[0] + -0x18) + (char)local_230);
    std::ostream::put((char)local_230);
    std::ostream::flush();
    p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
  } while( true );
}

Assistant:

std::string CFG::toDOT() const {
	std::stringstream ss;
	int unknown = 1;

	ss << std::hex;
	ss << "digraph \"0x" << m_addr << "\" {" << std::endl;
	ss << "  label = \"0x" << m_addr << " (" << m_functionName << ")\"" << std::endl;
    ss << "  labelloc = \"t\"" << std::endl;
    ss << "  node[shape=record]" << std::endl;
    ss << std::endl;

	for (CfgNode* node : m_nodes) {
		switch (node->type()) {
			case CfgNode::CFG_ENTRY:
			    ss << "  Entry [label=\"\",width=0.3,height=0.3,shape=circle,fillcolor=black,style=filled]" << std::endl;
			    break;
			case CfgNode::CFG_EXIT:
				ss << "  Exit [label=\"\",width=0.3,height=0.3,shape=circle,fillcolor=black,style=filled,peripheries=2]" << std::endl;
			    break;
			case CfgNode::CFG_HALT:
				ss << "  Halt [label=\"\",width=0.3,height=0.3,shape=square,fillcolor=black,style=filled,peripheries=2]" << std::endl;
			    break;
			case CfgNode::CFG_BLOCK: {
				assert(node->data() != 0);
				CfgNode::BlockData* blockData = static_cast<CfgNode::BlockData*>(node->data());

				Addr addr =  blockData->addr();
				ss << "  \"0x" << addr << "\" [label=\"{" << std::endl;
				ss << "    0x" << addr << " [" << std::dec << blockData->size() << "]\\l" << std::endl;

				std::list<Instruction*> instrs = blockData->instructions();
				if (instrs.size() > 0) {
					ss << "    | [instrs]\\l" << std::endl;
					for (std::list<Instruction*>::const_iterator it = instrs.cbegin(), ed = instrs.cend();
							it != ed; it++) {
						Instruction* instr = *it;
						ss << "    &nbsp;&nbsp;0x" << std::hex << instr->addr() << " \\<+"
								<< std::dec << instr->size() << "\\>: " << dotFilter(instr->text())
								<< "\\l" << std::endl;
					}
				}

				const std::set<CfgCall*>& calls = blockData->calls();
				if (!calls.empty()) {
					ss << "    | [calls]\\l" << std::endl;
					for (std::set<CfgCall*>::const_iterator it = calls.cbegin(), ed = calls.cend();
							it != ed; it++) {
						CFG* called = (*it)->called();
						unsigned long long count = (*it)->count();

						ss << std::hex << "    &nbsp;&nbsp;0x" << called->addr();
						if (count > 0)
							ss << std::dec << " \\{" << count << "\\} ";

						ss << " ("
							<< dotFilter(called->functionName()) << ")\\l" << std::endl;
					}
				}

				const std::set<CfgSignalHandler*>& signalHandlers = blockData->signalHandlers();
				if (!signalHandlers.empty()) {
					ss << "    | [signals]\\l" << std::endl;
					for (std::set<CfgSignalHandler*>::const_iterator it = signalHandlers.cbegin(),
							ed = signalHandlers.cend(); it != ed; it++) {
						int sigid = (*it)->sigid();
						CFG* handler = (*it)->handler();
						unsigned long long count = (*it)->count();

						ss << std::dec << "    &nbsp;&nbsp;" << std::setfill('0') << std::setw(2) << sigid << ": ";
						ss << std::hex << "0x" << handler->addr();
						if (count > 0)
							ss << std::dec << " \\{" << count << "\\} ";

						ss << " ("
							<< dotFilter(handler->functionName()) << ")\\l" << std::endl;
					}
				}

				ss << "  }\"]" << std::endl;

                if (blockData->indirect()) {
					ss << "  \"Unknown" << std::dec << unknown << "\" [label=\"?\", shape=none]" << std::endl;
					ss << "  \"0x" << std::hex << blockData->addr() << "\" -> \"Unknown" << std::dec << unknown << "\" [style=dashed]" << std::endl;
                    unknown++;
                }

				ss << std::hex;
				break;
			}
			case CfgNode::CFG_PHANTOM: {
				assert(node->data() != 0);
				CfgNode::PhantomData* phantomData = static_cast<CfgNode::PhantomData*>(node->data());

				ss << "  \"0x" << phantomData->addr() << "\" [label=\"{" << std::endl;
				ss << "     0x" << phantomData->addr() << "\\l" << std::endl;
				ss << "  }\", style=dashed]" << std::endl;

				break;
			}
			default:
				assert(false);
		}
	}

	for (CfgEdge* edge : m_edges) {
		ss << std::hex;

		CfgNode* src = edge->source();
		switch (src->type()) {
			case CfgNode::CFG_ENTRY:
				ss << "  Entry -> ";
				break;
			case CfgNode::CFG_BLOCK:
			case CfgNode::CFG_PHANTOM:
				ss << "  \"0x" << CfgNode::node2addr(src) << "\" -> ";
				break;
			default:
				assert(false);
		}

		CfgNode* dst = edge->destination();
		switch (dst->type()) {
			case CfgNode::CFG_EXIT:
				ss << "Exit";
				break;
			case CfgNode::CFG_HALT:
				ss << "Halt";
				break;
			case CfgNode::CFG_BLOCK:
			case CfgNode::CFG_PHANTOM:
				ss << "\"0x" << CfgNode::node2addr(dst) << "\"";
				break;
			case CfgNode::CFG_ENTRY:
			default:
				assert(false);
		}

		if (src->type() == CfgNode::CFG_ENTRY)
			ss << std::dec << " [label=\" " << this->execs() << "\"]";
		else
			ss << std::dec << " [label=\" " << edge->count() << "\"]";

		ss << std::endl;
	}

	ss << "}" << std::endl;

	return ss.str();
}